

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr
xmlCtxtNewInputFromString(xmlParserCtxtPtr ctxt,char *url,char *str,char *encoding,int flags)

{
  xmlParserInputPtr input;
  
  if (str != (char *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    input = xmlNewInputFromString(url,str,flags);
    if (input != (xmlParserInputPtr)0x0) {
      if (encoding == (char *)0x0) {
        return input;
      }
      xmlSwitchInputEncodingName(ctxt,input,encoding);
      return input;
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromString(xmlParserCtxtPtr ctxt, const char *url,
                          const char *str, const char *encoding, int flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (str == NULL))
	return(NULL);

    input = xmlNewInputFromString(url, str, flags);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}